

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

void ctemplate_htmlparser::enter_value(statemachine_ctx *ctx,int start,char chr,int end)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  
  pvVar1 = ctx->user;
  if (pvVar1 != (void *)0x0) {
    *(undefined4 *)((long)pvVar1 + 0x20) = 0;
    uVar3 = 0;
    if ((*(char *)((long)pvVar1 + 0x128) == 'o') && (*(char *)((long)pvVar1 + 0x129) == 'n')) {
      puVar2 = *(undefined8 **)((long)pvVar1 + 0x18);
      *(undefined1 *)(puVar2 + 1) = 0;
      *puVar2 = 0;
      jsparser_reset(*(jsparser_ctx **)((long)pvVar1 + 0x10));
      uVar3 = 1;
    }
    *(undefined4 *)((long)pvVar1 + 0x24) = uVar3;
    return;
  }
  __assert_fail("html != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x202,"void ctemplate_htmlparser::enter_value(statemachine_ctx *, int, char, int)")
  ;
}

Assistant:

static void enter_value(statemachine_ctx *ctx, int start, char chr, int end)
{
  htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
  assert(html != NULL);

  html->value_index = 0;

  if (is_js_attribute(html->attr)) {
    entityfilter_reset(html->entityfilter);
    jsparser_reset(html->jsparser);
    html->in_js = 1;
  } else {
    html->in_js = 0;
  }
}